

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  int iVar1;
  size_t sVar2;
  int local_4c;
  char *local_38;
  char *e;
  char *pcStack_28;
  int szhint_local;
  char *fname_local;
  int idx_local;
  lua_State *L_local;
  
  lua_pushvalue(L,idx);
  pcStack_28 = fname;
  do {
    local_38 = strchr(pcStack_28,0x2e);
    if (local_38 == (char *)0x0) {
      sVar2 = strlen(pcStack_28);
      local_38 = pcStack_28 + sVar2;
    }
    lua_pushlstring(L,pcStack_28,(long)local_38 - (long)pcStack_28);
    lua_rawget(L,-2);
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) {
      lua_settop(L,-2);
      local_4c = szhint;
      if (*local_38 == '.') {
        local_4c = 1;
      }
      lua_createtable(L,0,local_4c);
      lua_pushlstring(L,pcStack_28,(long)local_38 - (long)pcStack_28);
      lua_pushvalue(L,-2);
      lua_settable(L,-4);
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 5) {
        lua_settop(L,-3);
        return pcStack_28;
      }
    }
    lua_remove(L,-2);
    pcStack_28 = local_38 + 1;
  } while (*local_38 == '.');
  return (char *)0x0;
}

Assistant:

LUALIB_API const char *luaL_findtable(lua_State *L, int idx,
				      const char *fname, int szhint)
{
  const char *e;
  lua_pushvalue(L, idx);
  do {
    e = strchr(fname, '.');
    if (e == NULL) e = fname + strlen(fname);
    lua_pushlstring(L, fname, (size_t)(e - fname));
    lua_rawget(L, -2);
    if (lua_isnil(L, -1)) {  /* no such field? */
      lua_pop(L, 1);  /* remove this nil */
      lua_createtable(L, 0, (*e == '.' ? 1 : szhint)); /* new table for field */
      lua_pushlstring(L, fname, (size_t)(e - fname));
      lua_pushvalue(L, -2);
      lua_settable(L, -4);  /* set new table into field */
    } else if (!lua_istable(L, -1)) {  /* field has a non-table value? */
      lua_pop(L, 2);  /* remove table and value */
      return fname;  /* return problematic part of the name */
    }
    lua_remove(L, -2);  /* remove previous table */
    fname = e + 1;
  } while (*e == '.');
  return NULL;
}